

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

void __thiscall
lzham::lzham_decompressor::reset_huffman_table_update_rates(lzham_decompressor *this)

{
  uint i_1;
  uint i;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar1;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar2;
  
  quasi_adaptive_huffman_data_model::reset_update_rate
            ((quasi_adaptive_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  quasi_adaptive_huffman_data_model::reset_update_rate
            ((quasi_adaptive_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  quasi_adaptive_huffman_data_model::reset_update_rate
            ((quasi_adaptive_huffman_data_model *)
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  for (uVar2 = 0; uVar2 < 2; uVar2 = uVar2 + 1) {
    quasi_adaptive_huffman_data_model::reset_update_rate
              ((quasi_adaptive_huffman_data_model *)CONCAT44(uVar2,in_stack_fffffffffffffff0));
  }
  for (uVar1 = 0; uVar1 < 2; uVar1 = uVar1 + 1) {
    quasi_adaptive_huffman_data_model::reset_update_rate
              ((quasi_adaptive_huffman_data_model *)CONCAT44(uVar2,uVar1));
  }
  quasi_adaptive_huffman_data_model::reset_update_rate
            ((quasi_adaptive_huffman_data_model *)CONCAT44(uVar2,uVar1));
  return;
}

Assistant:

void lzham_decompressor::reset_huffman_table_update_rates()
   {
      m_lit_table.reset_update_rate();
      m_delta_lit_table.reset_update_rate();

      m_main_table.reset_update_rate();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_rep_len_table); i++)
         m_rep_len_table[i].reset_update_rate();

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_large_len_table); i++)
         m_large_len_table[i].reset_update_rate();

      m_dist_lsb_table.reset_update_rate();
   }